

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_movo(DisasContext *s,int d_offset,int s_offset)

{
  TCGContext *tcg_ctx_00;
  TCGContext *tcg_ctx;
  int s_offset_local;
  int d_offset_local;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  tcg_gen_ld_i64_x86_64(tcg_ctx_00,s->tmp1_i64,tcg_ctx_00->cpu_env,(long)s_offset);
  tcg_gen_st_i64_x86_64(tcg_ctx_00,s->tmp1_i64,tcg_ctx_00->cpu_env,(long)d_offset);
  tcg_gen_ld_i64_x86_64(tcg_ctx_00,s->tmp1_i64,tcg_ctx_00->cpu_env,(long)s_offset + 8);
  tcg_gen_st_i64_x86_64(tcg_ctx_00,s->tmp1_i64,tcg_ctx_00->cpu_env,(long)d_offset + 8);
  return;
}

Assistant:

static inline void gen_op_movo(DisasContext *s, int d_offset, int s_offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_ld_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, s_offset + offsetof(ZMMReg, ZMM_Q(0)));
    tcg_gen_st_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, d_offset + offsetof(ZMMReg, ZMM_Q(0)));
    tcg_gen_ld_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, s_offset + offsetof(ZMMReg, ZMM_Q(1)));
    tcg_gen_st_i64(tcg_ctx, s->tmp1_i64, tcg_ctx->cpu_env, d_offset + offsetof(ZMMReg, ZMM_Q(1)));
}